

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O1

void gprefs_from_str(char *str,keyvalwhere *mapping,int nvals,Conf *conf,int primary)

{
  int iVar1;
  uint uVar2;
  char *ptr;
  uint uVar3;
  uint secondary;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  char *__s2;
  
  ptr = dupstr(str);
  secondary = 0;
  uVar3 = 0;
  __s2 = ptr;
  do {
    for (; *__s2 == ','; __s2 = __s2 + 1) {
    }
    pcVar6 = __s2;
    if (*__s2 == '\0') {
      safefree(ptr);
      do {
        do {
          if (nvals <= (int)secondary) {
            return;
          }
        } while (nvals < 1);
        uVar7 = 0;
        do {
          iVar1 = mapping[uVar7].v;
          if (iVar1 < 0) {
            __assert_fail("mapping[i].v >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                          ,0x182,
                          "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                         );
          }
          if (0x1f < iVar1) {
            __assert_fail("mapping[i].v < 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                          ,0x183,
                          "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                         );
          }
          if ((uVar3 & 1 << ((byte)iVar1 & 0x1f)) == 0) {
            iVar1 = mapping[uVar7].vrel;
            uVar2 = secondary;
            if (iVar1 == -1) {
LAB_00119c03:
              uVar5 = mapping[uVar7].where >> 0x1f & secondary;
            }
            else {
              if ((uVar3 & 1 << ((byte)iVar1 & 0x1f)) == 0) goto LAB_00119cb0;
              if (iVar1 == -1) goto LAB_00119c03;
              if ((int)secondary < 1) {
LAB_00119cd8:
                __assert_fail("j < n",
                              "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                              ,0x197,
                              "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                             );
              }
              uVar5 = 0;
              while (iVar1 = conf_get_int_int(conf,primary,uVar5), iVar1 != mapping[uVar7].vrel) {
                uVar5 = uVar5 + 1;
                if (secondary == uVar5) goto LAB_00119cd8;
              }
              uVar5 = uVar5 - (~mapping[uVar7].where >> 0x1f);
            }
            while ((int)uVar5 < (int)uVar2) {
              iVar1 = conf_get_int_int(conf,primary,uVar2 - 1);
              conf_set_int_int(conf,primary,uVar2,iVar1);
              uVar2 = uVar2 - 1;
            }
            conf_set_int_int(conf,primary,uVar5,mapping[uVar7].v);
            uVar3 = uVar3 | 1 << ((byte)mapping[uVar7].v & 0x1f);
            secondary = secondary + 1;
          }
LAB_00119cb0:
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)nvals);
      } while( true );
    }
    for (; *pcVar6 != '\0'; pcVar6 = pcVar6 + 1) {
      if (*pcVar6 == ',') {
        *pcVar6 = '\0';
        pcVar6 = pcVar6 + 1;
        break;
      }
    }
    iVar1 = -1;
    if (0 < nvals) {
      lVar4 = 0;
      do {
        iVar1 = strcmp(*(char **)((long)&mapping->s + lVar4),__s2);
        if (iVar1 == 0) {
          iVar1 = *(int *)((long)&mapping->v + lVar4);
          goto LAB_00119b01;
        }
        lVar4 = lVar4 + 0x18;
      } while ((ulong)(uint)nvals * 0x18 != lVar4);
      iVar1 = -1;
    }
LAB_00119b01:
    __s2 = pcVar6;
    if ((iVar1 != -1) && (uVar2 = 1 << ((byte)iVar1 & 0x1f), (uVar3 & uVar2) == 0)) {
      uVar3 = uVar3 | uVar2;
      conf_set_int_int(conf,primary,secondary,iVar1);
      secondary = secondary + 1;
    }
  } while( true );
}

Assistant:

static void gprefs_from_str(const char *str,
                            const struct keyvalwhere *mapping, int nvals,
                            Conf *conf, int primary)
{
    char *commalist = dupstr(str);
    char *p, *q;
    int i, j, n, v, pos;
    unsigned long seen = 0;            /* bitmap for weeding dups etc */

    /*
     * Go through that list and convert it into values.
     */
    n = 0;
    p = commalist;
    while (1) {
        while (*p && *p == ',') p++;
        if (!*p)
            break;                     /* no more words */

        q = p;
        while (*p && *p != ',') p++;
        if (*p) *p++ = '\0';

        v = key2val(mapping, nvals, q);
        if (v != -1 && !(seen & (1 << v))) {
            seen |= (1 << v);
            conf_set_int_int(conf, primary, n, v);
            n++;
        }
    }

    sfree(commalist);

    /*
     * Now go through 'mapping' and add values that weren't mentioned
     * in the list we fetched. We may have to loop over it multiple
     * times so that we add values before other values whose default
     * positions depend on them.
     */
    while (n < nvals) {
        for (i = 0; i < nvals; i++) {
            assert(mapping[i].v >= 0);
            assert(mapping[i].v < 32);

            if (!(seen & (1 << mapping[i].v))) {
                /*
                 * This element needs adding. But can we add it yet?
                 */
                if (mapping[i].vrel != -1 && !(seen & (1 << mapping[i].vrel)))
                    continue;          /* nope */

                /*
                 * OK, we can work out where to add this element, so
                 * do so.
                 */
                if (mapping[i].vrel == -1) {
                    pos = (mapping[i].where < 0 ? n : 0);
                } else {
                    for (j = 0; j < n; j++)
                        if (conf_get_int_int(conf, primary, j) ==
                            mapping[i].vrel)
                            break;
                    assert(j < n);     /* implied by (seen & (1<<vrel)) */
                    pos = (mapping[i].where < 0 ? j : j+1);
                }

                /*
                 * And add it.
                 */
                for (j = n-1; j >= pos; j--)
                    conf_set_int_int(conf, primary, j+1,
                                     conf_get_int_int(conf, primary, j));
                conf_set_int_int(conf, primary, pos, mapping[i].v);
                seen |= (1 << mapping[i].v);
                n++;
            }
        }
    }
}